

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::AsmJsByteCodeWriter::AsmBr(AsmJsByteCodeWriter *this,ByteCodeLabel labelID,OpCodeAsmJs op)

{
  undefined4 local_2c [2];
  OpLayoutAsmBr data;
  
  ByteCodeWriter::CheckOpen(&this->super_ByteCodeWriter);
  ByteCodeWriter::CheckLabel(&this->super_ByteCodeWriter,labelID);
  local_2c[0] = 4;
  ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
            (&(this->super_ByteCodeWriter).m_byteCodeData,op,local_2c,4,&this->super_ByteCodeWriter,
             false);
  AddJumpOffset(this,EndOfBlock,labelID,4);
  return;
}

Assistant:

void AsmJsByteCodeWriter::AsmBr(ByteCodeLabel labelID, OpCodeAsmJs op)
    {
        CheckOpen();
        CheckLabel(labelID);

        size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutAsmBr) - offsetof(OpLayoutAsmBr, RelativeJumpOffset);
        OpLayoutAsmBr data;
        data.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
        AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
    }